

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t archive_read_format_zip_read_data_skip_streamable(archive_read *a)

{
  byte bVar1;
  ushort uVar2;
  void *pvVar3;
  long lVar4;
  bool bVar5;
  int64_t iVar6;
  char *pcVar7;
  int64_t *offset;
  char *pcVar8;
  wchar_t wVar9;
  void *buff;
  size_t size;
  void *local_40;
  size_t local_38;
  
  pvVar3 = a->format->data;
  iVar6 = __archive_read_consume(a,*(int64_t *)((long)pvVar3 + 0x60));
  *(undefined8 *)((long)pvVar3 + 0x60) = 0;
  if (iVar6 < 0) {
    wVar9 = L'\xffffffe2';
  }
  else {
    wVar9 = L'\0';
    if (*(char *)((long)pvVar3 + 0x9a) == '\0') {
      lVar4 = *(long *)((long)pvVar3 + 0x68);
      uVar2 = *(ushort *)(lVar4 + 0x7e);
      offset = (int64_t *)(ulong)uVar2;
      if (((uVar2 & 8) == 0) || (0 < *(long *)(lVar4 + 0x28))) {
        iVar6 = __archive_read_consume(a,*(int64_t *)((long)pvVar3 + 0x70));
        wVar9 = (uint)(iVar6 >> 0x3f) & 0xffffffe2;
      }
      else {
        if (*(char *)((long)pvVar3 + 0x148) != '\0') {
          *(undefined4 *)((long)pvVar3 + 0x30) = 1;
          if ((uVar2 & 0x40) == 0) {
            if (*(char *)(lVar4 + 0x80) == 'c') {
              wVar9 = init_WinZip_AES_decryption(a);
            }
            else {
              wVar9 = init_traditional_PKWARE_decryption(a);
            }
          }
          else {
            wVar9 = read_decryption_header(a);
          }
          if (wVar9 != L'\0') {
            return wVar9;
          }
          *(undefined1 *)((long)pvVar3 + 0x148) = 0;
        }
        wVar9 = L'\0';
        if (*(char *)(*(long *)((long)pvVar3 + 0x68) + 0x80) == '\b') {
          do {
            if (*(char *)((long)pvVar3 + 0x9a) != '\0') {
              return L'\0';
            }
            local_40 = (void *)0x0;
            local_38 = 0;
            wVar9 = zip_read_data_deflate(a,&local_40,&local_38,offset);
          } while (wVar9 == L'\0');
        }
        else {
          do {
            pcVar7 = (char *)__archive_read_ahead(a,0x10,(ssize_t *)&local_40);
            if ((long)local_40 < 0x10) {
              bVar5 = false;
              archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
              wVar9 = L'\xffffffe2';
            }
            else {
              pcVar8 = pcVar7;
              while (pcVar8 <= (char *)((long)local_40 + (long)pcVar7) + -0x10) {
                bVar1 = pcVar8[3];
                if (bVar1 < 0x4b) {
                  if (bVar1 == 7) {
                    pcVar8 = pcVar8 + 1;
                  }
                  else {
                    if ((((bVar1 == 8) && (pcVar8[2] == '\a')) && (pcVar8[1] == 'K')) &&
                       (*pcVar8 == 'P')) {
                      if ((*(byte *)(*(long *)((long)pvVar3 + 0x68) + 0x82) & 1) == 0) {
                        lVar4 = 0x10 - (long)pcVar7;
                      }
                      else {
                        lVar4 = 0x18 - (long)pcVar7;
                      }
                      __archive_read_consume(a,(int64_t)(pcVar8 + lVar4));
                      bVar5 = false;
                      wVar9 = L'\0';
                      goto LAB_0050afcc;
                    }
LAB_0050afaa:
                    pcVar8 = pcVar8 + 4;
                  }
                }
                else if (bVar1 == 0x50) {
                  pcVar8 = pcVar8 + 3;
                }
                else {
                  if (bVar1 != 0x4b) goto LAB_0050afaa;
                  pcVar8 = pcVar8 + 2;
                }
              }
              __archive_read_consume(a,(long)pcVar8 - (long)pcVar7);
              bVar5 = true;
            }
LAB_0050afcc:
          } while (bVar5);
        }
      }
    }
  }
  return wVar9;
}

Assistant:

static int
archive_read_format_zip_read_data_skip_streamable(struct archive_read *a)
{
	struct zip *zip;
	int64_t bytes_skipped;

	zip = (struct zip *)(a->format->data);
	bytes_skipped = __archive_read_consume(a, zip->unconsumed);
	zip->unconsumed = 0;
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	/* If we've already read to end of data, we're done. */
	if (zip->end_of_entry)
		return (ARCHIVE_OK);

	/* So we know we're streaming... */
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    || zip->entry->compressed_size > 0) {
		/* We know the compressed length, so we can just skip. */
		bytes_skipped = __archive_read_consume(a,
					zip->entry_bytes_remaining);
		if (bytes_skipped < 0)
			return (ARCHIVE_FATAL);
		return (ARCHIVE_OK);
	}

	if (zip->init_decryption) {
		int r;

		zip->has_encrypted_entries = 1;
		if (zip->entry->zip_flags & ZIP_STRONG_ENCRYPTED)
			r = read_decryption_header(a);
		else if (zip->entry->compression == WINZIP_AES_ENCRYPTION)
			r = init_WinZip_AES_decryption(a);
		else
			r = init_traditional_PKWARE_decryption(a);
		if (r != ARCHIVE_OK)
			return (r);
		zip->init_decryption = 0;
	}

	/* We're streaming and we don't know the length. */
	/* If the body is compressed and we know the format, we can
	 * find an exact end-of-entry by decompressing it. */
	switch (zip->entry->compression) {
#ifdef HAVE_ZLIB_H
	case 8: /* Deflate compression. */
		while (!zip->end_of_entry) {
			int64_t offset = 0;
			const void *buff = NULL;
			size_t size = 0;
			int r;
			r =  zip_read_data_deflate(a, &buff, &size, &offset);
			if (r != ARCHIVE_OK)
				return (r);
		}
		return ARCHIVE_OK;
#endif
	default: /* Uncompressed or unknown. */
		/* Scan for a PK\007\010 signature. */
		for (;;) {
			const char *p, *buff;
			ssize_t bytes_avail;
			buff = __archive_read_ahead(a, 16, &bytes_avail);
			if (bytes_avail < 16) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated ZIP file data");
				return (ARCHIVE_FATAL);
			}
			p = buff;
			while (p <= buff + bytes_avail - 16) {
				if (p[3] == 'P') { p += 3; }
				else if (p[3] == 'K') { p += 2; }
				else if (p[3] == '\007') { p += 1; }
				else if (p[3] == '\010' && p[2] == '\007'
				    && p[1] == 'K' && p[0] == 'P') {
					if (zip->entry->flags & LA_USED_ZIP64)
						__archive_read_consume(a,
						    p - buff + 24);
					else
						__archive_read_consume(a,
						    p - buff + 16);
					return ARCHIVE_OK;
				} else { p += 4; }
			}
			__archive_read_consume(a, p - buff);
		}
	}
}